

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  MemTable *in_stack_ffffffffffffffa8;
  CondVar *in_stack_ffffffffffffffb8;
  TableCache *this_00;
  atomic<bool> *in_stack_ffffffffffffffc0;
  VersionSet *this_01;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__DBImpl_016178b0;
  port::Mutex::Lock((Mutex *)in_stack_ffffffffffffffa8);
  std::atomic<bool>::store
            (in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0),
             (memory_order)in_stack_ffffffffffffffb8);
  while ((*(byte *)(in_RDI + 0x43) & 1) != 0) {
    port::CondVar::Wait(in_stack_ffffffffffffffb8);
  }
  port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffffa8);
  if (in_RDI[0x18] != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x70))(local_10,(long *)in_RDI[1],in_RDI[0x18]);
    Status::~Status((Status *)in_stack_ffffffffffffffa8);
  }
  this_01 = (VersionSet *)in_RDI[0x45];
  if (this_01 != (VersionSet *)0x0) {
    VersionSet::~VersionSet(this_01);
    operator_delete(this_01,0x250);
  }
  if (in_RDI[0x26] != 0) {
    MemTable::Unref(in_stack_ffffffffffffffa8);
  }
  if (in_RDI[0x27] != 0) {
    MemTable::Unref(in_stack_ffffffffffffffa8);
  }
  pvVar1 = (void *)in_RDI[0x37];
  if (pvVar1 != (void *)0x0) {
    WriteBatch::~WriteBatch((WriteBatch *)in_stack_ffffffffffffffa8);
    operator_delete(pvVar1,0x20);
  }
  pvVar1 = (void *)in_RDI[0x2b];
  if (pvVar1 != (void *)0x0) {
    log::Writer::~Writer((Writer *)in_stack_ffffffffffffffa8);
    operator_delete(pvVar1,0x20);
  }
  if ((long *)in_RDI[0x29] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x29] + 8))();
  }
  this_00 = (TableCache *)in_RDI[0x17];
  if (this_00 != (TableCache *)0x0) {
    TableCache::~TableCache(this_00);
    operator_delete(this_00,0x38);
  }
  if (((*(byte *)(in_RDI + 0x12) & 1) != 0) && ((long *)in_RDI[9] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[9] + 8))();
  }
  if (((*(byte *)((long)in_RDI + 0x91) & 1) != 0) &&
     (in_stack_ffffffffffffffa8 = (MemTable *)in_RDI[0xc],
     in_stack_ffffffffffffffa8 != (MemTable *)0x0)) {
    (*(in_stack_ffffffffffffffa8->comparator_).comparator.super_Comparator._vptr_Comparator[1])();
  }
  Status::~Status((Status *)in_stack_ffffffffffffffa8);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffffa8);
  SnapshotList::~SnapshotList((SnapshotList *)in_stack_ffffffffffffffa8);
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::~deque
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)this_00
            );
  port::CondVar::~CondVar((CondVar *)in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8);
  InternalFilterPolicy::~InternalFilterPolicy((InternalFilterPolicy *)in_stack_ffffffffffffffa8);
  InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)in_stack_ffffffffffffffa8);
  DB::~DB((DB *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish.
  mutex_.Lock();
  shutting_down_.store(true, std::memory_order_release);
  while (background_compaction_scheduled_) {
    background_work_finished_signal_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_ != nullptr) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_ != nullptr) mem_->Unref();
  if (imm_ != nullptr) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}